

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O0

int cuddTestInteract(DdManager *table,int x,int y)

{
  int iVar1;
  int tmp;
  int result;
  int bit;
  int word;
  int posn;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  word = y;
  posn = x;
  if (y < x) {
    word = x;
    posn = y;
  }
  iVar1 = (((table->size * 2 - posn) + -3) * posn >> 1) + word + -1;
  return (uint)(table->interact[iVar1 >> 6] >> ((byte)iVar1 & 0x3f)) & 1;
}

Assistant:

int
cuddTestInteract(
  DdManager * table,
  int  x,
  int  y)
{
    int posn, word, bit, result;

    if (x > y) {
        int tmp = x;
        x = y;
        y = tmp;
    }
#ifdef DD_DEBUG
    assert(x < y);
    assert(y < table->size);
    assert(x >= 0);
#endif

    posn = ((((table->size << 1) - x - 3) * x) >> 1) + y - 1;
    word = posn >> LOGBPL;
    bit = posn & (BPL-1);
    result = (table->interact[word] >> bit) & 1L;
    return(result);

}